

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall banksia::ChessBoard::make(ChessBoard *this,MoveFull *move,Hist *hist)

{
  uint64_t *puVar1;
  int *piVar2;
  byte bVar3;
  PieceType PVar4;
  Side SVar5;
  int iVar6;
  pointer pPVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint64_t uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar12;
  
  hist->enpassant = this->enpassant;
  hist->status = (this->super_BoardCore).status;
  hist->castleRights[0] = this->castleRights[0];
  hist->castleRights[1] = this->castleRights[1];
  iVar9 = (move->super_Move).dest;
  uVar8 = *(undefined8 *)&(move->super_Move).promotion;
  (hist->move).super_Move.from = (move->super_Move).from;
  (hist->move).super_Move.dest = iVar9;
  *(undefined8 *)&(hist->move).super_Move.promotion = uVar8;
  (hist->move).piece.side = (move->piece).side;
  hist->cap = (this->super_BoardCore).pieces.
              super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
              super__Vector_impl_data._M_start[(move->super_Move).dest];
  hist->hashKey = (this->super_BoardCore).hashKey;
  hist->quietCnt = (this->super_BoardCore).quietCnt;
  uVar11 = hashKeyEnpassant(this,this->enpassant);
  puVar1 = &(this->super_BoardCore).hashKey;
  *puVar1 = *puVar1 ^ uVar11;
  iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])
                    (this,(ulong)(uint)(move->super_Move).from);
  puVar1 = &(this->super_BoardCore).hashKey;
  *puVar1 = *puVar1 ^ CONCAT44(extraout_var,iVar9);
  if ((hist->cap).type != empty) {
    iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])
                      (this,(ulong)(uint)(move->super_Move).dest);
    puVar1 = &(this->super_BoardCore).hashKey;
    *puVar1 = *puVar1 ^ CONCAT44(extraout_var_00,iVar9);
  }
  iVar9 = (move->super_Move).from;
  pPVar7 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  PVar4 = pPVar7[iVar9].type;
  SVar5 = pPVar7[iVar9].side;
  iVar6 = (move->super_Move).dest;
  pPVar7[iVar6].type = PVar4;
  pPVar7[iVar6].side = SVar5;
  pPVar7[iVar9].type = empty;
  pPVar7[iVar9].side = none;
  iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])(this);
  puVar1 = &(this->super_BoardCore).hashKey;
  *puVar1 = *puVar1 ^ CONCAT44(extraout_var_01,iVar9);
  piVar2 = &(this->super_BoardCore).quietCnt;
  *piVar2 = *piVar2 + 1;
  this->enpassant = -1;
  if (((int)this->castleRights[1] + (int)this->castleRights[0] != 0) && ((hist->cap).type == rook))
  {
    (*(this->super_BoardCore).super_Obj._vptr_Obj[0x19])
              (this,(ulong)(uint)(move->super_Move).dest,(ulong)(hist->cap).side);
  }
  if (PVar4 == pawn) {
    iVar9 = (move->super_Move).from;
    uVar12 = (move->super_Move).dest;
    if (((iVar9 - uVar12) + 0x10 & 0xffffffdf) == 0) {
      this->enpassant = (int)(uVar12 + iVar9) / 2;
      goto LAB_001658ac;
    }
    if (uVar12 == hist->enpassant) {
      uVar12 = (uVar12 + (uint)(SVar5 == white) * 0x10) - 8;
      hist->cap = (this->super_BoardCore).pieces.
                  super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar12];
      iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])(this,(ulong)uVar12);
      puVar1 = &(this->super_BoardCore).hashKey;
      *puVar1 = *puVar1 ^ CONCAT44(extraout_var_03,iVar9);
      pPVar7 = (this->super_BoardCore).pieces.
               super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
               super__Vector_impl_data._M_start + (int)uVar12;
      pPVar7->type = empty;
      pPVar7->side = none;
      goto LAB_001658ac;
    }
    if ((move->super_Move).promotion == empty) goto LAB_001658ac;
    iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])(this,(ulong)uVar12);
    puVar1 = &(this->super_BoardCore).hashKey;
    *puVar1 = *puVar1 ^ CONCAT44(extraout_var_04,iVar9);
    (this->super_BoardCore).pieces.
    super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
    super__Vector_impl_data._M_start[(move->super_Move).dest].type = (move->super_Move).promotion;
  }
  else {
    if (PVar4 == rook) {
      if ((int)this->castleRights[1] + (int)this->castleRights[0] != 0) {
        (*(this->super_BoardCore).super_Obj._vptr_Obj[0x19])
                  (this,(ulong)(uint)(move->super_Move).from,(ulong)SVar5);
      }
      goto LAB_001658ac;
    }
    if (PVar4 != king) goto LAB_001658ac;
    this->castleRights[(int)SVar5] =
         this->castleRights[(int)SVar5] &
         ~((byte)this->CastleRight_short | (byte)this->CastleRight_long);
    iVar9 = (move->super_Move).from;
    iVar6 = (move->super_Move).dest;
    if (((iVar9 - iVar6) + 2U & 0xfffffffb) != 0) goto LAB_001658ac;
    uVar12 = iVar9 + 3;
    if (iVar6 <= iVar9) {
      uVar12 = iVar9 - 4;
    }
    iVar10 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])
                       (this,(ulong)uVar12,(long)(iVar6 + iVar9) % 2 & 0xffffffff);
    puVar1 = &(this->super_BoardCore).hashKey;
    *puVar1 = *puVar1 ^ CONCAT44(extraout_var_02,iVar10);
    pPVar7 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar7[(iVar6 + iVar9) / 2] = pPVar7[(int)uVar12];
    pPVar7 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start + (int)uVar12;
    pPVar7->type = empty;
    pPVar7->side = none;
  }
  iVar9 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x10])(this);
  puVar1 = &(this->super_BoardCore).hashKey;
  *puVar1 = *puVar1 ^ CONCAT44(extraout_var_05,iVar9);
  (this->super_BoardCore).quietCnt = 0;
LAB_001658ac:
  if ((hist->cap).type != empty) {
    (this->super_BoardCore).quietCnt = 0;
  }
  bVar3 = this->castleRights[1];
  if (hist->castleRights[1] != bVar3) {
    uVar12 = (uint)(char)(hist->castleRights[1] ^ bVar3);
    if ((this->CastleRight_short & uVar12) != 0) {
      puVar1 = &(this->super_BoardCore).hashKey;
      *puVar1 = *puVar1 ^ *RandomCastle;
      uVar12 = (uint)(char)(bVar3 ^ hist->castleRights[1]);
    }
    if ((this->CastleRight_long & uVar12) != 0) {
      puVar1 = &(this->super_BoardCore).hashKey;
      *puVar1 = *puVar1 ^ RandomCastle[1];
    }
  }
  bVar3 = this->castleRights[0];
  if (hist->castleRights[0] != bVar3) {
    uVar12 = (uint)(char)(hist->castleRights[0] ^ bVar3);
    if ((this->CastleRight_short & uVar12) != 0) {
      puVar1 = &(this->super_BoardCore).hashKey;
      *puVar1 = *puVar1 ^ RandomCastle[2];
      uVar12 = (uint)(char)(bVar3 ^ hist->castleRights[0]);
    }
    if ((this->CastleRight_long & uVar12) != 0) {
      puVar1 = &(this->super_BoardCore).hashKey;
      *puVar1 = *puVar1 ^ RandomCastle[3];
    }
  }
  uVar11 = hashKeyEnpassant(this,this->enpassant);
  puVar1 = &(this->super_BoardCore).hashKey;
  *puVar1 = *puVar1 ^ uVar11;
  return;
}

Assistant:

void ChessBoard::make(const MoveFull& move, Hist& hist) {
    assert(istHashKeyValid());
    
    hist.enpassant = enpassant;
    hist.status = status;
    hist.castleRights[0] = castleRights[0];
    hist.castleRights[1] = castleRights[1];
    hist.move = move;
    hist.cap = pieces[move.dest];
    hist.hashKey = hashKey;
    hist.quietCnt = quietCnt;
    
    hashKey ^= hashKeyEnpassant(enpassant);
    
    hashKey ^= xorHashKey(move.from);
    if (!hist.cap.isEmpty()) {
        hashKey ^= xorHashKey(move.dest);
    }
    
    auto p = pieces[move.from];
    pieces[move.dest] = p;
    pieces[move.from].setEmpty();
    
    hashKey ^= xorHashKey(move.dest);
    
    quietCnt++;
    enpassant = -1;
    
    if ((castleRights[0] + castleRights[1]) && hist.cap.type == PieceType::rook) {
        clearCastleRights(move.dest, hist.cap.side);
    }
    
    switch (p.type) {
        case PieceType::king: {
            castleRights[static_cast<int>(p.side)] &= ~(CastleRight_long|CastleRight_short);
            if (abs(move.from - move.dest) == 2) { // castle
                int rookPos = move.from + (move.from < move.dest ? 3 : -4);
                int newRookPos = (move.from + move.dest) / 2;
                
                hashKey ^= xorHashKey(rookPos);
                pieces[newRookPos] = pieces[rookPos];
                pieces[rookPos].setEmpty();
                hashKey ^= xorHashKey(newRookPos);
                quietCnt = 0;
            }
            break;
        }
            
        case PieceType::rook: {
            if (castleRights[0] + castleRights[1]) {
                clearCastleRights(move.from, p.side);
            }
            break;
        }
            
        case PieceType::pawn: {
            int d = abs(move.from - move.dest);
            
            if (d == 16) {
                enpassant = (move.from + move.dest) / 2;
            } else if (move.dest == hist.enpassant) {
                int ep = move.dest + (p.side == Side::white ? +8 : -8);
                hist.cap = pieces[ep];
                
                hashKey ^= xorHashKey(ep);
                pieces[ep].setEmpty();
            } else {
                if (move.promotion != PieceType::empty) {
                    hashKey ^= xorHashKey(move.dest);
                    pieces[move.dest].type = move.promotion;
                    hashKey ^= xorHashKey(move.dest);
                    quietCnt = 0;
                }
            }
            break;
        }
        default:
            break;
    }
    
    if (!hist.cap.isEmpty()) {
        quietCnt = 0;
    }
    
    if (hist.castleRights[W] != castleRights[W]) {
        if ((hist.castleRights[W] & CastleRight_short) != (castleRights[W] & CastleRight_short)) {
            hashKey ^= RandomCastle[0];
        }
        if ((hist.castleRights[W] & CastleRight_long) != (castleRights[W] & CastleRight_long)) {
            hashKey ^= RandomCastle[1];
        }
    }
    if (hist.castleRights[B] != castleRights[B]) {
        if ((hist.castleRights[B] & CastleRight_short) != (castleRights[B] & CastleRight_short)) {
            hashKey ^= RandomCastle[2];
        }
        if ((hist.castleRights[B] & CastleRight_long) != (castleRights[B] & CastleRight_long)) {
            hashKey ^= RandomCastle[3];
        }
    }
    
    hashKey ^= hashKeyEnpassant(enpassant);
}